

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::GeometricPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,GeometricPrimitive *this,Ray *r
          ,Float tMax)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  Float FVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 in_XMM3 [16];
  DispatchSplit<6> local_1ed;
  float local_1ec;
  Float va;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  undefined8 uStack_1d4;
  MediumHandle local_1c8;
  optional<pbrt::ShapeIntersection> si;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_a8;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_a0;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_98;
  double vb;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float local_7c;
  Float local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined1 local_64 [16];
  float local_54;
  
  vb = (double)(this->shape).
               super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
               .bits;
  local_1ec = tMax;
  va = tMax;
  detail::DispatchSplit<6>::operator()(&si,&local_1ed,r,&va,&vb,(ulong)vb >> 0x30);
  if (si.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    _va = (double)CONCAT44(fStack_1e4,si.optionalValue._248_4_);
    vb = (double)local_1ec * 1.001;
    if (vb <= (double)(float)si.optionalValue._248_4_) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/primitive.cpp"
                 ,0x39,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [9])"si->tHit",
                 (char (*) [13])"1.001 * tMax",(char (*) [9])"si->tHit",&va,
                 (char (*) [13])"1.001 * tMax",&vb);
    }
    uVar5 = (this->alpha).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    if ((uVar5 & 0xffffffffffff) != 0) {
      auVar2._4_4_ = si.optionalValue._4_4_;
      auVar2._0_4_ = si.optionalValue._0_4_;
      auVar2._8_4_ = si.optionalValue._8_4_;
      auVar2._12_4_ = si.optionalValue._12_4_;
      auVar7 = vinsertps_avx(auVar2,ZEXT416((uint)si.optionalValue._12_4_),0x10);
      auVar9._0_4_ = (float)si.optionalValue._4_4_ + auVar7._0_4_;
      auVar9._4_4_ = (float)si.optionalValue._8_4_ + auVar7._4_4_;
      auVar9._8_4_ = auVar7._8_4_ + 0.0;
      auVar9._12_4_ = auVar7._12_4_ + 0.0;
      auVar7._8_4_ = 0x3f000000;
      auVar7._0_8_ = 0x3f0000003f000000;
      auVar7._12_4_ = 0x3f000000;
      auVar7 = vmulps_avx512vl(auVar9,auVar7);
      fStack_88 = ((float)si.optionalValue._16_4_ + (float)si.optionalValue._20_4_) * 0.5;
      local_70 = si.optionalValue._228_4_;
      local_78 = (Float)si.optionalValue._220_4_;
      vb = (double)vmovlps_avx(auVar7);
      fStack_84 = (float)si.optionalValue._208_8_;
      fStack_80 = (float)((ulong)si.optionalValue._208_8_ >> 0x20);
      local_7c = (float)si.optionalValue._216_4_;
      uStack_6c = si.optionalValue._52_4_;
      auVar3._8_8_ = si.optionalValue._240_8_;
      auVar3._0_8_ = si.optionalValue._232_8_;
      local_64 = vpermilps_avx(auVar3,0xd8);
      local_54 = (float)si.optionalValue._188_4_;
      _va = (double)uVar5;
      FVar8 = detail::DispatchSplit<12>::operator()
                        ((DispatchSplit<12> *)&local_1ed,&vb,&va,uVar5 >> 0x30);
      fVar10 = 1.0;
      if (FVar8 < 1.0) {
        if (0.0 < FVar8) {
          uVar5 = *(long *)&(r->d).super_Tuple3<pbrt::Vector3,_float> * -0x395b586ca42e166b;
          uVar5 = (((uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                   -0x395b586ca42e166b ^ (ulong)(uint)(r->d).super_Tuple3<pbrt::Vector3,_float>.z) *
                  -0x395b586ca42e166b;
          uVar5 = (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b;
          uVar6 = *(long *)&(r->o).super_Tuple3<pbrt::Point3,_float> * -0x395b586ca42e166b;
          uVar5 = ((uVar5 >> 0x2f ^ (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b ^ uVar5 ^
                   0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^
                  (ulong)(uint)(r->o).super_Tuple3<pbrt::Point3,_float>.z) * -0x395b586ca42e166b;
          lVar4 = (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b;
          auVar7 = vcvtusi2ss_avx512f(in_XMM3,(uint)((ulong)lVar4 >> 0x2f) ^ (uint)lVar4);
          fVar10 = auVar7._0_4_ * 2.3283064e-10;
        }
        if (FVar8 < fVar10) {
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
          }
          Interaction::SpawnRay((RayDifferential *)&vb,(Interaction *)&si,&r->d);
          uStack_1d4._4_4_ = local_78;
          uStack_1d4._0_4_ = local_7c;
          fStack_1d8 = fStack_80;
          _va = vb;
          fStack_1e0 = fStack_88;
          fStack_1dc = fStack_84;
          local_1c8.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits._4_4_ = uStack_6c;
          local_1c8.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits._0_4_ = local_70;
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
          }
          Intersect(__return_storage_ptr__,this,(Ray *)&va,
                    local_1ec - (float)si.optionalValue._248_4_);
          if (__return_storage_ptr__->set != true) {
            return __return_storage_ptr__;
          }
          if (si.set != false) {
            *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
                 (float)si.optionalValue._248_4_ +
                 *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8);
            return __return_storage_ptr__;
          }
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
        }
      }
    }
    if (si.set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
    }
    local_98.bits =
         (this->material).
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    local_a0.bits =
         (this->areaLight).
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    local_a8.bits =
         (r->medium).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    SurfaceInteraction::SetIntersectionProperties
              ((SurfaceInteraction *)&si,(MaterialHandle *)&local_98,(LightHandle *)&local_a0,
               &this->mediumInterface,(MediumHandle *)&local_a8);
    __return_storage_ptr__->set = si.set;
    if (si.set == true) {
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = si.optionalValue._64_8_
      ;
      aVar1._4_4_ = si.optionalValue._4_4_;
      aVar1._0_4_ = si.optionalValue._0_4_;
      (__return_storage_ptr__->optionalValue).__align = aVar1;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
           CONCAT44(si.optionalValue._12_4_,si.optionalValue._8_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
           CONCAT44(si.optionalValue._20_4_,si.optionalValue._16_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = si.optionalValue._24_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = si.optionalValue._32_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = si.optionalValue._40_8_
      ;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           CONCAT44(si.optionalValue._52_4_,si.optionalValue._48_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
           CONCAT44(si.optionalValue._60_4_,si.optionalValue._56_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = si.optionalValue._72_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = si.optionalValue._80_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = si.optionalValue._88_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = si.optionalValue._96_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
           si.optionalValue._104_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) =
           si.optionalValue._112_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
           si.optionalValue._120_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
           si.optionalValue._128_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
           si.optionalValue._136_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
           si.optionalValue._128_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
           si.optionalValue._136_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
           si.optionalValue._144_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
           si.optionalValue._152_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) =
           si.optionalValue._160_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
           si.optionalValue._168_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
           si.optionalValue._176_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xb8) =
           CONCAT44(si.optionalValue._188_4_,si.optionalValue._184_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) =
           si.optionalValue._192_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = si.optionalValue._200_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
           si.optionalValue._208_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xd8) =
           CONCAT44(si.optionalValue._220_4_,si.optionalValue._216_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
           CONCAT44(si.optionalValue._228_4_,si.optionalValue._224_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) =
           si.optionalValue._232_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) =
           si.optionalValue._240_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
           si.optionalValue._248_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> GeometricPrimitive::Intersect(const Ray &r,
                                                                Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);
    // Test intersection against alpha texture, if present
    if (alpha) {
        if (Float a = alpha.Evaluate(si->intr); a < 1) {
            // Potentially skip intersection, depending on stochastic alpha test
            Float u = (a <= 0) ? 1.f : (uint32_t(Hash(r.o, r.d)) * 0x1p-32f);
            if (u > a) {
                // Ignore this intersection and trace a new ray
                Ray rNext = si->intr.SpawnRay(r.d);
                pstd::optional<ShapeIntersection> siNext =
                    Intersect(rNext, tMax - si->tHit);
                if (siNext)
                    siNext->tHit += si->tHit;
                return siNext;
            }
        }
    }

    // Initialize _SurfaceInteraction_ after _Shape_ intersection
    si->intr.SetIntersectionProperties(material, areaLight, &mediumInterface, r.medium);

    return si;
}